

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

App * __thiscall CLI::App::ignore_underscore(App *this,bool value)

{
  App *pAVar1;
  string *__rhs;
  OptionAlreadyAdded *this_00;
  App *base;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (((int)CONCAT71(in_register_00000031,value) != 0) && (this->ignore_underscore_ == false)) {
    this->ignore_underscore_ = true;
    pAVar1 = this->parent_;
    base = this;
    if (this->parent_ != (App *)0x0) {
      do {
        base = pAVar1;
        if (base->parent_ == (App *)0x0) break;
        pAVar1 = base->parent_;
      } while ((base->name_)._M_string_length == 0);
    }
    __rhs = _compare_subcommand_names_abi_cxx11_(this,this,base);
    if (__rhs->_M_string_length != 0) {
      this->ignore_underscore_ = false;
      this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&bStack_38,"ignore underscore would cause subcommand name conflicts: ",__rhs)
      ;
      OptionAlreadyAdded::OptionAlreadyAdded(this_00,&bStack_38);
      __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
  }
  this->ignore_underscore_ = value;
  return this;
}

Assistant:

CLI11_INLINE App *App::ignore_underscore(bool value) {
    if(value && !ignore_underscore_) {
        ignore_underscore_ = true;
        auto *p = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        const auto &match = _compare_subcommand_names(*this, *p);
        if(!match.empty()) {
            ignore_underscore_ = false;
            throw OptionAlreadyAdded("ignore underscore would cause subcommand name conflicts: " + match);
        }
    }
    ignore_underscore_ = value;
    return this;
}